

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O2

int __thiscall IInput::CursorRelative(IInput *this,float *pX,float *pY)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  undefined4 extraout_var;
  
  iVar2 = (*(this->super_IInterface)._vptr_IInterface[0xc])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*(this->super_IInterface)._vptr_IInterface[7])(this);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if ((plVar3 == (long *)0x0) ||
       (cVar1 = (**(code **)(*plVar3 + 0x40))(plVar3,pX,pY), cVar1 == '\0')) {
      iVar2 = 0;
    }
    else {
      iVar2 = 2;
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CursorRelative(float *pX, float *pY)
	{
		if(MouseRelative(pX, pY))
			return CURSOR_MOUSE;
		IJoystick *pJoystick = GetActiveJoystick();
		if(pJoystick && pJoystick->Relative(pX, pY))
			return CURSOR_JOYSTICK;
		return CURSOR_NONE;
	}